

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# macho.cc
# Opt level: O0

void bloaty::macho::ParseSymbolsFromSymbolTable<nlist>
               (LoadCommand *cmd,SymbolTable *table,RangeSink *sink)

{
  string_view data;
  string_view data_00;
  string_view data_01;
  string_view data_02;
  DataSource DVar1;
  symtab_command *vmaddr;
  size_type sVar2;
  RangeSink *in_RDX;
  RangeSink *in_RSI;
  char *in_RDI;
  pair<unsigned_int,_unsigned_long> pVar3;
  __enable_if_t<is_constructible<value_type,_pair<basic_string_view<char>,_pair<unsigned_int,_unsigned_long>_>_>::value,_pair<iterator,_bool>_>
  _Var4;
  RangeSink *unaff_retaddr;
  string_view in_stack_00000008;
  string_view name;
  string_view name_region;
  string_view sym_range;
  nlist *sym;
  uint32_t i;
  uint32_t nsyms;
  string_view strtab;
  string_view symtab;
  symtab_command *symtab_cmd;
  DataSource in_stack_000002fc;
  string_view in_stack_00000300;
  pair<unsigned_int,_unsigned_long> *in_stack_fffffffffffffe58;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_fffffffffffffe60;
  RangeSink *in_stack_fffffffffffffe68;
  RangeSink *pRVar5;
  RangeSink *in_stack_fffffffffffffe70;
  size_t in_stack_fffffffffffffe78;
  string_view *in_stack_fffffffffffffe80;
  basic_string_view<char,_std::char_traits<char>_> local_158;
  _Base_ptr local_148;
  undefined1 local_140;
  uint local_138;
  unsigned_long local_130;
  size_t local_f8;
  char *pcStack_f0;
  string_view local_e0 [2];
  string_view local_c0;
  size_t local_b0;
  char *local_a8;
  string_view local_a0;
  basic_string_view<char,_std::char_traits<char>_> local_90;
  nlist *local_80;
  uint local_78;
  uint local_74;
  undefined8 local_70;
  undefined8 local_68;
  string_view local_60;
  undefined8 local_50;
  undefined8 local_48;
  string_view local_40;
  string *name_00;
  uint64_t vmsize;
  
  name_00 = *(string **)(in_RDI + 8);
  vmsize = *(uint64_t *)(in_RDI + 0x10);
  data._M_str = (char *)in_stack_fffffffffffffe60;
  data._M_len = (size_t)in_stack_fffffffffffffe58;
  vmaddr = GetStructPointer<symtab_command>(data);
  local_50 = *(undefined8 *)(in_RDI + 0x18);
  local_48 = *(undefined8 *)(in_RDI + 0x20);
  data_01._M_str = (char *)in_stack_fffffffffffffe80;
  data_01._M_len = in_stack_fffffffffffffe78;
  local_40 = StrictSubstr(data_01,(size_t)in_stack_fffffffffffffe70,
                          (size_t)in_stack_fffffffffffffe68);
  local_70 = *(undefined8 *)(in_RDI + 0x18);
  local_68 = *(undefined8 *)(in_RDI + 0x20);
  data_02._M_str = (char *)in_stack_fffffffffffffe80;
  data_02._M_len = in_stack_fffffffffffffe78;
  local_60 = StrictSubstr(data_02,(size_t)in_stack_fffffffffffffe70,
                          (size_t)in_stack_fffffffffffffe68);
  local_74 = vmaddr->nsyms;
  for (local_78 = 0; local_78 < local_74; local_78 = local_78 + 1) {
    local_80 = GetStructPointerAndAdvance<nlist>(in_stack_fffffffffffffe80);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_90,(char *)local_80,0xc);
    if (((local_80->n_type & 0xe0) == 0) && (local_80->n_value != 0)) {
      local_b0 = local_60._M_len;
      local_a8 = local_60._M_str;
      data_00._M_str = (char *)in_stack_fffffffffffffe70;
      data_00._M_len = (size_t)in_stack_fffffffffffffe68;
      local_a0 = StrictSubstr(data_00,(size_t)in_stack_fffffffffffffe60);
      local_c0 = ReadNullTerminated((string_view *)0x1dc3d3);
      DVar1 = RangeSink::data_source(in_RDX);
      pRVar5 = in_RSI;
      if (6 < (int)DVar1) {
        local_f8 = local_c0._M_len;
        pcStack_f0 = local_c0._M_str;
        pRVar5 = in_RDX;
        RangeSink::data_source(in_RDX);
        in_stack_fffffffffffffe80 = local_e0;
        ItaniumDemangle_abi_cxx11_(in_stack_00000300,in_stack_000002fc);
        RangeSink::AddVMRange(in_RSI,(char *)pRVar5,(uint64_t)vmaddr,vmsize,name_00);
        std::__cxx11::string::~string((string *)local_e0);
        in_stack_fffffffffffffe70 = in_RDX;
        in_RDX = pRVar5;
        pRVar5 = in_RSI;
      }
      in_RSI = pRVar5;
      if (pRVar5 != (RangeSink *)0x0) {
        pVar3 = std::make_pair<unsigned_int_const&,unsigned_long_const&>
                          ((uint *)in_stack_fffffffffffffe60,
                           (unsigned_long *)in_stack_fffffffffffffe58);
        local_130 = pVar3.second;
        local_138 = pVar3.first;
        std::
        make_pair<std::basic_string_view<char,std::char_traits<char>>&,std::pair<unsigned_int,unsigned_long>>
                  (in_stack_fffffffffffffe60,in_stack_fffffffffffffe58);
        _Var4 = std::
                map<std::basic_string_view<char,std::char_traits<char>>,std::pair<unsigned_long,unsigned_long>,std::less<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::pair<unsigned_long,unsigned_long>>>>
                ::
                insert<std::pair<std::basic_string_view<char,std::char_traits<char>>,std::pair<unsigned_int,unsigned_long>>>
                          ((map<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<unsigned_long,_unsigned_long>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<unsigned_long,_unsigned_long>_>_>_>
                            *)in_stack_fffffffffffffe70,
                           (pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<unsigned_int,_unsigned_long>_>
                            *)pRVar5);
        local_148 = (_Base_ptr)_Var4.first._M_node;
        local_140 = _Var4.second;
        in_stack_fffffffffffffe68 = pRVar5;
      }
      in_stack_fffffffffffffe60 =
           (basic_string_view<char,_std::char_traits<char>_> *)
           std::basic_string_view<char,_std::char_traits<char>_>::data(&local_c0);
      sVar2 = std::basic_string_view<char,_std::char_traits<char>_>::size(&local_c0);
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (&local_158,(char *)in_stack_fffffffffffffe60,sVar2 + 1);
      RangeSink::AddFileRangeForVMAddr(unaff_retaddr,in_RDI,(uint64_t)in_RSI,in_stack_00000008);
      RangeSink::AddFileRangeForVMAddr(unaff_retaddr,in_RDI,(uint64_t)in_RSI,in_stack_00000008);
    }
  }
  return;
}

Assistant:

void ParseSymbolsFromSymbolTable(const LoadCommand& cmd, SymbolTable* table,
                                 RangeSink* sink) {
  auto symtab_cmd = GetStructPointer<symtab_command>(cmd.command_data);

  string_view symtab = StrictSubstr(cmd.file_data, symtab_cmd->symoff,
                                    symtab_cmd->nsyms * sizeof(NList));
  string_view strtab =
      StrictSubstr(cmd.file_data, symtab_cmd->stroff, symtab_cmd->strsize);

  uint32_t nsyms = symtab_cmd->nsyms;
  for (uint32_t i = 0; i < nsyms; i++) {
    auto sym = GetStructPointerAndAdvance<NList>(&symtab);
    string_view sym_range(reinterpret_cast<const char*>(sym), sizeof(NList));

    if (sym->n_type & N_STAB || sym->n_value == 0) {
      continue;
    }

    string_view name_region = StrictSubstr(strtab, sym->n_un.n_strx);
    string_view name = ReadNullTerminated(&name_region);

    if (sink->data_source() >= DataSource::kSymbols) {
      sink->AddVMRange("macho_symbols", sym->n_value, RangeSink::kUnknownSize,
                       ItaniumDemangle(name, sink->data_source()));
    }

    if (table) {
      table->insert(std::make_pair(
          name, std::make_pair(sym->n_value, RangeSink::kUnknownSize)));
    }

    // Capture the trailing NULL.
    name = string_view(name.data(), name.size() + 1);
    sink->AddFileRangeForVMAddr("macho_symtab_name", sym->n_value, name);
    sink->AddFileRangeForVMAddr("macho_symtab_sym", sym->n_value, sym_range);
  }
}